

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O2

void AdjustPusher(int tag,int magnitude,int angle,bool wind)

{
  ulong uVar1;
  uint affectee;
  FThinkerCollection *pFVar2;
  DPusher *this;
  undefined7 in_register_00000009;
  ulong uVar3;
  EPusher type;
  TArray<FThinkerCollection,_FThinkerCollection> Collection;
  FThinkerCollection collect;
  FSectorTagIterator itr;
  
  Collection.Array = (FThinkerCollection *)0x0;
  Collection.Most = 0;
  Collection.Count = 0;
  TThinkerIterator<DPusher>::TThinkerIterator((TThinkerIterator<DPusher> *)&itr,0x80);
  type = (EPusher)CONCAT71(in_register_00000009,wind) ^ p_current;
  while( true ) {
    collect.Obj = FThinkerIterator::Next((FThinkerIterator *)&itr);
    if ((DPusher *)collect.Obj == (DPusher *)0x0) break;
    collect.RefNum = DPusher::CheckForSectorMatch((DPusher *)collect.Obj,type,tag);
    if (-1 < collect.RefNum) {
      DPusher::ChangeValues((DPusher *)collect.Obj,magnitude,angle);
      TArray<FThinkerCollection,_FThinkerCollection>::Push(&Collection,&collect);
    }
  }
  uVar1 = (ulong)Collection._8_8_ >> 0x20;
  if (tag == 0) {
    itr.start = 0;
  }
  else {
    itr.start = tagManager.TagHashFirst[tag & 0xff];
  }
  collect.Obj = (DThinker *)0x0;
  itr.searchtag = tag;
LAB_004c91b0:
  do {
    affectee = FSectorTagIterator::Next(&itr);
    if ((int)affectee < 0) {
      TArray<FThinkerCollection,_FThinkerCollection>::~TArray(&Collection);
      return;
    }
    pFVar2 = Collection.Array;
    uVar3 = uVar1;
    while (uVar3 != 0) {
      if (pFVar2->RefNum == sectors[affectee].sectornum) {
        if ((int)uVar3 != 0) goto LAB_004c91b0;
        break;
      }
      pFVar2 = pFVar2 + 1;
      uVar3 = uVar3 - 1;
    }
    this = (DPusher *)DObject::operator_new(0x70);
    DPusher::DPusher(this,type,(line_t *)0x0,magnitude,angle,(AActor *)0x0,affectee);
  } while( true );
}

Assistant:

void AdjustPusher (int tag, int magnitude, int angle, bool wind)
{
	DPusher::EPusher type = wind? DPusher::p_wind : DPusher::p_current;
	
	// Find pushers already attached to the sector, and change their parameters.
	TArray<FThinkerCollection> Collection;
	{
		TThinkerIterator<DPusher> iterator;
		FThinkerCollection collect;

		while ( (collect.Obj = iterator.Next ()) )
		{
			if ((collect.RefNum = ((DPusher *)collect.Obj)->CheckForSectorMatch (type, tag)) >= 0)
			{
				((DPusher *)collect.Obj)->ChangeValues (magnitude, angle);
				Collection.Push (collect);
			}
		}
	}

	size_t numcollected = Collection.Size ();
	int secnum;

	// Now create pushers for any sectors that don't already have them.
	FSectorTagIterator itr(tag);
	while ((secnum = itr.Next()) >= 0)
	{
		unsigned int i;
		for (i = 0; i < numcollected; i++)
		{
			if (Collection[i].RefNum == sectors[secnum].sectornum)
				break;
		}
		if (i == numcollected)
		{
			new DPusher (type, NULL, magnitude, angle, NULL, secnum);
		}
	}
}